

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O1

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CProgram *statement)

{
  CMainClass *pCVar1;
  CClassList *pCVar2;
  __uniq_ptr_data<CClass,_std::default_delete<CClass>,_true,_true> _Var3;
  pointer puVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CProgram\n",0x16);
  pCVar1 = (statement->mainClass)._M_t.
           super___uniq_ptr_impl<CMainClass,_std::default_delete<CMainClass>_>._M_t.
           super__Tuple_impl<0UL,_CMainClass_*,_std::default_delete<CMainClass>_>.
           super__Head_base<0UL,_CMainClass_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
  pCVar2 = (statement->classList)._M_t.
           super___uniq_ptr_impl<CClassList,_std::default_delete<CClassList>_>._M_t.
           super__Tuple_impl<0UL,_CClassList_*,_std::default_delete<CClassList>_>.
           super__Head_base<0UL,_CClassList_*,_false>._M_head_impl;
  for (puVar4 = *(pointer *)
                 &(pCVar2->classes).
                  super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
                  ._M_impl;
      puVar4 != *(pointer *)
                 ((long)&(pCVar2->classes).
                         super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
                 + 8); puVar4 = puVar4 + 1) {
    _Var3.super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>._M_t.
    super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
    super__Head_base<0UL,_CClass_*,_false>._M_head_impl =
         (puVar4->_M_t).super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>;
    (*(code *)**(undefined8 **)
                _Var3.super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>._M_t.
                super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
                super__Head_base<0UL,_CClass_*,_false>._M_head_impl)
              (_Var3.super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>._M_t.
               super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
               super__Head_base<0UL,_CClass_*,_false>._M_head_impl,this);
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CProgram &statement ) {
    std::cout << "IRT builder: CProgram\n";
    statement.mainClass->Accept( *this );
    std::vector<std::unique_ptr<CClass>> &classDeclarations = statement.classList->classes;
    for ( auto it = classDeclarations.begin( ); it != classDeclarations.end( ); ++it ) {
        ( *it )->Accept( *this );
    }
}